

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall CommandReader::submit_buffer(CommandReader *this)

{
  bool bVar1;
  ulong uVar2;
  allocator local_71;
  string local_70 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_50 [3];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_38;
  key_type local_30 [8];
  __string_type content;
  CommandReader *this_local;
  
  std::__cxx11::stringstream::str();
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) || ((this->forced & 1U) != 0)) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->arguments,local_30);
    }
    else {
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&bb_commands_abi_cxx11_,local_30);
      local_50[0]._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&bb_commands_abi_cxx11_);
      bVar1 = std::__detail::operator!=(&local_38,local_50);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->executable,BUSYBOX);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->arguments,local_30);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->arguments,local_30);
        std::__cxx11::string::swap((string *)&this->executable);
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  std::__cxx11::stringstream::str((string *)&this->buffer);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::ios::clear(&this->buffer + *(long *)(*(long *)&this->buffer + -0x18),0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void submit_buffer() {
    auto content = this->buffer.str();
    // ignore multiple empty characters, but submit if quoted
    if (!content.empty() || this->forced) {
      if (this->executable.empty()) {
        if (bb_commands.find(content) != bb_commands.end()) {
          // use busybox provided command
          this->executable = BUSYBOX;
          this->arguments.push_back(std::move(content));
        } else {
          // command as-is. argv[0] should also be executable path
          this->arguments.push_back(content);
          this->executable.swap(content);
        }
      } else {
        this->arguments.push_back(std::move(content));
      }
    }

    this->buffer.str("");
    this->buffer.clear();
  }